

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.h
# Opt level: O3

void __thiscall HuffTree::TreeNode::~TreeNode(TreeNode *this)

{
  TreeNode *pTVar1;
  
  pTVar1 = (this->_right)._M_t.
           super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
           super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
           super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
  if (pTVar1 != (TreeNode *)0x0) {
    std::default_delete<HuffTree::TreeNode>::operator()
              ((default_delete<HuffTree::TreeNode> *)&this->_right,pTVar1);
  }
  (this->_right)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
  pTVar1 = (this->_left)._M_t.
           super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
           super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
           super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
  if (pTVar1 != (TreeNode *)0x0) {
    std::default_delete<HuffTree::TreeNode>::operator()
              ((default_delete<HuffTree::TreeNode> *)&this->_left,pTVar1);
  }
  (this->_left)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
  return;
}

Assistant:

TreeNode() noexcept = default;